

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_componentNotEqualByMath_Test::TestBody(Equality_componentNotEqualByMath_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_168 [2];
  AssertHelper local_148 [8];
  Message local_140 [8];
  shared_ptr<libcellml::Entity> local_138;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_f0 [8];
  Message local_e8 [8];
  shared_ptr<libcellml::Entity> local_e0;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  ComponentPtr c1Alt;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ComponentPtr c1;
  Equality_componentNotEqualByMath_Test *this_local;
  
  c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"child1",&local_41);
  libcellml::Component::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"child1",&local_89);
  libcellml::Component::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"math",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Component::setMath((string *)peVar3);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Component,void>
            (&local_e0,(shared_ptr<libcellml::Component> *)local_68);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_c9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar2) {
    testing::Message::Message(local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_c8,"c1->equals(c1Alt)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x308,pcVar4);
    testing::internal::AssertHelper::operator=(local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Component,void>
            (&local_138,(shared_ptr<libcellml::Component> *)local_20);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_121 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_138);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar2) {
    testing::Message::Message(local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_168,local_120,"c1Alt->equals(c1)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x309,pcVar4);
    testing::internal::AssertHelper::operator=(local_148,local_140);
    testing::internal::AssertHelper::~AssertHelper(local_148);
    std::__cxx11::string::~string((string *)local_168);
    testing::Message::~Message(local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_68);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_20);
  return;
}

Assistant:

TEST(Equality, componentNotEqualByMath)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("child1");
    libcellml::ComponentPtr c1Alt = libcellml::Component::create("child1");

    c1Alt->setMath("math");

    EXPECT_FALSE(c1->equals(c1Alt));
    EXPECT_FALSE(c1Alt->equals(c1));
}